

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O0

void __thiscall
halfFunction<Imath_3_2::half>::halfFunction<Imf_3_4::roundNBit>
          (halfFunction<Imath_3_2::half> *this,roundNBit f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  bool bVar1;
  half hVar2;
  void *pvVar3;
  long *in_RDI;
  undefined2 in_R8W;
  float fVar4;
  undefined2 in_stack_00000010;
  half x;
  int i;
  roundNBit *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  half in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc6;
  undefined2 *local_38;
  half local_1e;
  int local_1c;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  
  local_10 = in_stack_00000010;
  local_a = in_R8W;
  pvVar3 = operator_new__(0x20000);
  *in_RDI = (long)pvVar3;
  local_1c = 0;
  do {
    if (0xffff < local_1c) {
      return;
    }
    Imath_3_2::half::setBits(&local_1e,(uint16_t)local_1c);
    bVar1 = Imath_3_2::half::isNan
                      ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                        CONCAT24(in_stack_ffffffffffffffc4._h,
                                                 in_stack_ffffffffffffffc0)));
    if (bVar1) {
      *(undefined2 *)(*in_RDI + (long)local_1c * 2) = local_10;
    }
    else {
      bVar1 = Imath_3_2::half::isInfinity
                        ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                          CONCAT24(in_stack_ffffffffffffffc4._h,
                                                   in_stack_ffffffffffffffc0)));
      if (bVar1) {
        bVar1 = Imath_3_2::half::isNegative(&local_1e);
        if (bVar1) {
          local_38 = &local_e;
        }
        else {
          local_38 = &local_c;
        }
        *(undefined2 *)(*in_RDI + (long)local_1c * 2) = *local_38;
      }
      else {
        fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                            CONCAT24(in_stack_ffffffffffffffc4._h,
                                                     in_stack_ffffffffffffffc0)));
        in_stack_ffffffffffffffc4._h = SUB42(fVar4,0);
        in_stack_ffffffffffffffc6 = (undefined2)((uint)fVar4 >> 0x10);
        fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                            CONCAT24(in_stack_ffffffffffffffc4._h,
                                                     in_stack_ffffffffffffffc0)));
        if (fVar4 <= (float)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4._h)) {
          in_stack_ffffffffffffffc0 =
               Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4._h,
                                                    in_stack_ffffffffffffffc0)));
          fVar4 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT26(in_stack_ffffffffffffffc6,
                                              CONCAT24(in_stack_ffffffffffffffc4._h,
                                                       in_stack_ffffffffffffffc0)));
          if (in_stack_ffffffffffffffc0 <= fVar4) {
            hVar2 = Imf_3_4::roundNBit::operator()
                              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc4);
            *(uint16_t *)(*in_RDI + (long)local_1c * 2) = hVar2._h;
            goto LAB_001a1354;
          }
        }
        *(undefined2 *)(*in_RDI + (long)local_1c * 2) = local_a;
      }
    }
LAB_001a1354:
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (
    Function f,
    half     domainMin,
    half     domainMax,
    T        defaultValue,
    T        posInfValue,
    T        negInfValue,
    T        nanValue)
{
#ifndef IMATH_HAVE_LARGE_STACK
    _lut = new T[1 << 16];
#endif

    for (int i = 0; i < (1 << 16); i++)
    {
        half x;
        x.setBits (i);

        if (x.isNan ())
            _lut[i] = nanValue;
        else if (x.isInfinity ())
            _lut[i] = x.isNegative () ? negInfValue : posInfValue;
        else if (x < domainMin || x > domainMax)
            _lut[i] = defaultValue;
        else
            _lut[i] = f (x);
    }
}